

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

void spvtools::opt::anon_unknown_0::CreateDecoration
               (DecorationManager *decoration_mgr,uint32_t var_id,Decoration decoration,
               uint32_t literal)

{
  pointer *__ptr_1;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this;
  long lVar1;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  undefined1 local_170 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_150;
  undefined1 local_148 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_128;
  undefined1 local_120 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_100;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_f8;
  undefined4 local_d8 [2];
  SmallVector<unsigned_int,_2UL> local_d0;
  undefined4 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined4 local_78;
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  local_148._24_8_ = local_148 + 0x10;
  local_148._0_8_ = &PTR__SmallVector_00930a20;
  local_128._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_148._8_8_ = 1;
  local_d8[0] = 1;
  local_d0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
  local_d0.size_ = 0;
  local_d0.small_data_ = (uint *)local_d0.buffer;
  local_d0.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_148._16_4_ = var_id;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&local_d0,(SmallVector<unsigned_int,_2UL> *)local_148);
  local_170._24_8_ = local_170 + 0x10;
  local_170._0_8_ = &PTR__SmallVector_00930a20;
  local_150._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_170._8_8_ = 1;
  local_a8 = 0x1c;
  local_a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
  local_a0.size_ = 0;
  local_a0.small_data_ = (uint *)local_a0.buffer;
  local_a0.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_170._16_4_ = decoration;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&local_a0,(SmallVector<unsigned_int,_2UL> *)local_170);
  local_120._24_8_ = local_120 + 0x10;
  local_120._0_8_ = &PTR__SmallVector_00930a20;
  local_100._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_120._8_8_ = 1;
  local_78 = 6;
  local_70._0_8_ = &PTR__SmallVector_00930a20;
  local_70._8_8_ = 0;
  local_70._24_8_ = local_70 + 0x10;
  this = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_50;
  local_50._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_120._16_4_ = literal;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_70,(SmallVector<unsigned_int,_2UL> *)local_120)
  ;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_f8,
             local_d8,&local_48);
  lVar1 = -0x90;
  do {
    *(undefined ***)(this + -0x20) = &PTR__SmallVector_00930a20;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this);
    }
    *(undefined8 *)this = 0;
    this = this + -0x30;
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0);
  local_120._0_8_ = &PTR__SmallVector_00930a20;
  if (local_100._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_100,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_100._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_170._0_8_ = &PTR__SmallVector_00930a20;
  if (local_150._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_150,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_150._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_148._0_8_ = &PTR__SmallVector_00930a20;
  if (local_128._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_128,local_128._M_head_impl);
  }
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  analysis::DecorationManager::AddDecoration(decoration_mgr,OpDecorate,&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_f8);
  return;
}

Assistant:

void CreateDecoration(analysis::DecorationManager* decoration_mgr,
                      uint32_t var_id, spv::Decoration decoration,
                      uint32_t literal) {
  std::vector<Operand> operands({
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {var_id}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_DECORATION,
       {static_cast<uint32_t>(decoration)}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {literal}},
  });
  decoration_mgr->AddDecoration(spv::Op::OpDecorate, std::move(operands));
}